

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgio.c
# Opt level: O3

int fd_recv(int sock,int *fds,size_t nfds)

{
  int *piVar1;
  ssize_t sVar2;
  ulong uVar3;
  cmsghdr *__cmsg;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  iovec iov;
  msghdr msg;
  undefined1 local_12d;
  int local_12c;
  int *local_128;
  ulong local_120;
  int *local_118;
  size_t local_110;
  ulong local_108;
  iovec local_100;
  msghdr local_f0;
  fd_set local_b8;
  
  if (fds == (int *)0x0 || nfds == 0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    return -1;
  }
  local_108 = 1L << ((byte)sock & 0x3f);
  local_12c = sock + 1;
  uVar9 = 0;
  local_110 = nfds;
  while( true ) {
    uVar5 = local_110 - uVar9;
    if (0x5e7 < uVar5) {
      uVar5 = 0x5e8;
    }
    if (sock < 0) {
      __assert_fail("sock >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/msgio.c"
                    ,0x11d,"int fd_package_recv(int, int *, size_t)");
    }
    bzero(&local_f0,0x38);
    bzero(&local_100,0x10);
    local_100.iov_base = &local_12d;
    local_100.iov_len = 1;
    local_f0.msg_iov = &local_100;
    local_f0.msg_iovlen = 1;
    local_f0.msg_controllen = uVar5 * 0x18;
    local_f0.msg_control = calloc(1,local_f0.msg_controllen);
    if ((cmsghdr *)local_f0.msg_control == (cmsghdr *)0x0) break;
    local_118 = fds + uVar9;
    local_120 = uVar9;
    while( true ) {
      local_b8.fds_bits[0xe] = 0;
      local_b8.fds_bits[0xf] = 0;
      local_b8.fds_bits[0xc] = 0;
      local_b8.fds_bits[0xd] = 0;
      local_b8.fds_bits[10] = 0;
      local_b8.fds_bits[0xb] = 0;
      local_b8.fds_bits[8] = 0;
      local_b8.fds_bits[9] = 0;
      local_b8.fds_bits[6] = 0;
      local_b8.fds_bits[7] = 0;
      local_b8.fds_bits[4] = 0;
      local_b8.fds_bits[5] = 0;
      local_b8.fds_bits[2] = 0;
      local_b8.fds_bits[3] = 0;
      local_b8.fds_bits[0] = 0;
      local_b8.fds_bits[1] = 0;
      local_b8.fds_bits[(uint)sock >> 6] = local_b8.fds_bits[(uint)sock >> 6] | local_108;
      select(local_12c,&local_b8,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      sVar2 = recvmsg(sock,&local_f0,0x40000000);
      if (sVar2 != -1) break;
      piVar1 = __errno_location();
      iVar8 = *piVar1;
      if (iVar8 != 4) goto LAB_001068ca;
    }
    uVar9 = 0;
    bVar10 = false;
    if ((cmsghdr *)local_f0.msg_control != (cmsghdr *)0x0 && 0xf < local_f0.msg_controllen) {
      uVar3 = 0;
      __cmsg = (cmsghdr *)local_f0.msg_control;
      uVar6 = 0;
      local_128 = fds;
      do {
        if ((__cmsg->cmsg_level != 1) || (__cmsg->cmsg_type != 1)) {
LAB_00106881:
          piVar1 = __errno_location();
          *piVar1 = 0x16;
          uVar9 = (ulong)uVar6;
          fds = local_128;
          goto LAB_00106897;
        }
        uVar4 = __cmsg->cmsg_len + 0x3fffffff0;
        uVar7 = (int)(uVar4 >> 2) + uVar6;
        uVar9 = (ulong)uVar7;
        if (uVar5 < uVar9) goto LAB_00106881;
        memmove(local_118 + uVar3,__cmsg + 1,uVar4 & 0x3fffffffc);
        __cmsg = __cmsg_nxthdr(&local_f0,__cmsg);
      } while ((uVar9 < uVar5) && (uVar3 = uVar9, uVar6 = uVar7, __cmsg != (cmsghdr *)0x0));
      bVar10 = __cmsg != (cmsghdr *)0x0;
      fds = local_128;
    }
    uVar6 = (uint)uVar9;
    if ((bVar10) || (uVar9 < uVar5)) goto LAB_00106897;
    piVar1 = __errno_location();
    iVar8 = *piVar1;
    free(local_f0.msg_control);
    *piVar1 = iVar8;
    uVar9 = (ulong)(uint)((int)local_120 + (int)uVar5);
    if (local_110 <= uVar9) {
      return 0;
    }
  }
LAB_001068dc:
  piVar1 = __errno_location();
  iVar8 = *piVar1;
  if ((int)uVar9 != 0) {
    uVar5 = 0;
    do {
      close(fds[uVar5]);
      uVar5 = uVar5 + 1;
    } while ((uVar9 & 0xffffffff) != uVar5);
  }
  *piVar1 = iVar8;
  return -1;
LAB_00106897:
  piVar1 = local_118;
  if (uVar6 != 0) {
    uVar5 = 0;
    do {
      if (-1 < piVar1[uVar5]) {
        close(piVar1[uVar5]);
      }
      uVar5 = uVar5 + 1;
    } while (uVar9 != uVar5);
  }
  piVar1 = __errno_location();
  *piVar1 = 0x16;
  iVar8 = 0x16;
LAB_001068ca:
  free(local_f0.msg_control);
  *piVar1 = iVar8;
  uVar9 = local_120;
  goto LAB_001068dc;
}

Assistant:

int
fd_recv(int sock, int *fds, size_t nfds)
{
	unsigned int i, step, j;
	int ret, serrno;

	if (nfds == 0 || fds == NULL) {
		errno = EINVAL;
		return (-1);
	}

	ret = i = step = 0;
	while (i < nfds) {
		if (PKG_MAX_SIZE < nfds - i)
			step = PKG_MAX_SIZE;
		else
			step = nfds - i;
		ret = fd_package_recv(sock, fds + i, step);
		if (ret != 0) {
			/* Close all received descriptors. */
			serrno = errno;
			for (j = 0; j < i; j++)
				close(fds[j]);
			errno = serrno;
			break;
		}
		i += step;
	}

	return (ret);
}